

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void * __thiscall asmjit::Zone::allocZeroed(Zone *this,size_t size)

{
  uint8_t *__s;
  
  __s = this->_ptr;
  if ((ulong)((long)this->_end - (long)__s) < size) {
    __s = (uint8_t *)_alloc(this,size);
  }
  else {
    this->_ptr = __s + size;
    if (this->_end < __s + size) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                 ,0x9b,"_ptr <= _end");
    }
  }
  if (__s != (uint8_t *)0x0) {
    memset(__s,0,size);
  }
  return __s;
}

Assistant:

void* Zone::allocZeroed(size_t size) noexcept {
  void* p = alloc(size);
  if (ASMJIT_UNLIKELY(!p)) return p;
  return ::memset(p, 0, size);
}